

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O3

int AF_AActor_DamageMobj
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  AActor *inflictor;
  char *pcVar5;
  AActor *source;
  AActor *target;
  bool bVar6;
  FName local_3c;
  DAngle local_38;
  PClass *pPVar4;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_00400983;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00400961:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00400983:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                  ,0x630,
                  "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  target = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (target == (AActor *)0x0) goto LAB_0040073f;
    pPVar4 = (target->super_DThinker).super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar3 = (**(target->super_DThinker).super_DObject._vptr_DObject)(target);
      pPVar4 = (PClass *)CONCAT44(extraout_var,iVar3);
      (target->super_DThinker).super_DObject.Class = pPVar4;
    }
    bVar6 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar2 && bVar6) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar6 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar2) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (!bVar6) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00400983;
    }
  }
  else {
    if (target != (AActor *)0x0) goto LAB_00400961;
LAB_0040073f:
    target = (AActor *)0x0;
  }
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_004009a2;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_0040096a:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_004009a2:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                  ,0x631,
                  "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  inflictor = (AActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (inflictor == (AActor *)0x0) goto LAB_004007da;
    pPVar4 = (inflictor->super_DThinker).super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar3 = (**(inflictor->super_DThinker).super_DObject._vptr_DObject)(inflictor);
      pPVar4 = (PClass *)CONCAT44(extraout_var_00,iVar3);
      (inflictor->super_DThinker).super_DObject.Class = pPVar4;
    }
    bVar6 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar2 && bVar6) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar6 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar2) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (!bVar6) {
      pcVar5 = "inflictor == NULL || inflictor->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_004009a2;
    }
  }
  else {
    if (inflictor != (AActor *)0x0) goto LAB_0040096a;
LAB_004007da:
    inflictor = (AActor *)0x0;
  }
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 3) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_004009c1;
  }
  if (param[2].field_0.field_3.Type != '\x03') {
LAB_00400973:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_004009c1:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                  ,0x632,
                  "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  source = (AActor *)param[2].field_0.field_1.a;
  if (param[2].field_0.field_1.atag == 1) {
    if (source == (AActor *)0x0) goto LAB_0040087c;
    pPVar4 = (source->super_DThinker).super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar3 = (**(source->super_DThinker).super_DObject._vptr_DObject)(source);
      pPVar4 = (PClass *)CONCAT44(extraout_var_01,iVar3);
      (source->super_DThinker).super_DObject.Class = pPVar4;
    }
    bVar6 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar2 && bVar6) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar6 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar2) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (!bVar6) {
      pcVar5 = "source == NULL || source->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_004009c1;
    }
  }
  else {
    if (source != (AActor *)0x0) goto LAB_00400973;
LAB_0040087c:
    source = (AActor *)0x0;
  }
  if (numparam == 3) {
    pcVar5 = "(paramnum) < numparam";
LAB_004009e9:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                  ,0x633,
                  "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[3].field_0.field_3.Type != '\0') {
    pcVar5 = "param[paramnum].Type == REGT_INT";
    goto LAB_004009e9;
  }
  if (numparam < 5) {
    pcVar5 = "(paramnum) < numparam";
LAB_00400a11:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                  ,0x634,
                  "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[4].field_0.field_3.Type != '\0') {
    pcVar5 = "param[paramnum].Type == REGT_INT";
    goto LAB_00400a11;
  }
  pVVar1 = param + 3;
  local_3c.Index = param[4].field_0.i;
  if (numparam == 5) {
    param = defaultparam->Array;
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_00400a96:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                    ,0x635,
                    "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar3 = param[5].field_0.i;
  }
  else {
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_00400a96;
    }
    iVar3 = param[5].field_0.i;
    if (6 < (uint)numparam) {
      if (param[6].field_0.field_3.Type != '\x01') {
        pcVar5 = "(param[paramnum]).Type == REGT_FLOAT";
        goto LAB_00400a30;
      }
      goto LAB_00400901;
    }
    param = defaultparam->Array;
  }
  if (param[6].field_0.field_3.Type != '\x01') {
    pcVar5 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_00400a30:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                  ,0x636,
                  "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_00400901:
  local_38.Degrees = (double)param[6].field_0.field_1.a;
  iVar3 = P_DamageMobj(target,inflictor,source,(pVVar1->field_0).i,&local_3c,iVar3,&local_38);
  if (numret < 1) {
    iVar3 = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                    ,0x637,
                    "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (ret->RegType != '\0') {
      __assert_fail("RegType == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                    ,0x13f,"void VMReturn::SetInt(int)");
    }
    *(int *)ret->Location = iVar3;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, DamageMobj)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT(inflictor, AActor);
	PARAM_OBJECT(source, AActor);
	PARAM_INT(damage);
	PARAM_NAME(mod);
	PARAM_INT_DEF(flags);
	PARAM_FLOAT_DEF(angle);
	ACTION_RETURN_INT(P_DamageMobj(self, inflictor, source, damage, mod, flags, angle));
}